

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 stride;
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  Reduction *pRVar17;
  Reduction *pRVar18;
  int iVar19;
  uint uVar20;
  Reduction *pRVar21;
  byte bVar22;
  int iVar23;
  long lVar24;
  Reduction *pRVar25;
  uint uVar26;
  Reduction *unaff_RBP;
  long lVar27;
  void *pvVar28;
  ulong uVar29;
  Reduction *pRVar30;
  Reduction *pRVar31;
  size_t sVar32;
  size_t sVar33;
  int iVar34;
  pointer piVar35;
  float *pfVar36;
  void *pvVar37;
  float *pfVar38;
  float *pfVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  int iVar47;
  float fVar48;
  int iVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int axes_flag [4];
  float local_1a4;
  int local_194;
  Reduction *local_188;
  float *local_170;
  float *local_158;
  float *local_148;
  void *local_110;
  void *local_f0;
  undefined1 local_c8 [116];
  int iStack_54;
  pointer local_40;
  pointer local_38;
  
  uVar20 = bottom_blob->dims;
  piVar35 = (pointer)(ulong)uVar20;
  stack0xffffffffffffffa8 = (undefined1  [16])0x0;
  pRVar30 = (Reduction *)bottom_blob;
  if (this->reduce_all != 0) {
    iVar47 = 1;
    local_c8._84_4_ = 0;
    iVar56 = 1;
    local_c8._92_4_ = 0;
    bVar42 = true;
    bVar41 = true;
    goto LAB_0034097f;
  }
  lVar27 = (long)(this->axes).w;
  if (0 < lVar27) {
    pvVar28 = (this->axes).data;
    lVar24 = 0;
    do {
      iVar47 = *(int *)((long)pvVar28 + lVar24 * 4);
      pRVar30 = (Reduction *)(long)(int)((iVar47 >> 0x1f & uVar20) + iVar47);
      *(undefined4 *)(local_c8 + (long)pRVar30 * 4 + 0x70) = 1;
      lVar24 = lVar24 + 1;
    } while (lVar27 != lVar24);
  }
  iVar56 = local_c8._120_4_;
  switch(uVar20) {
  case 1:
    iVar47 = 0;
    local_c8._84_4_ = 0;
    iVar56 = 1;
    local_c8._92_4_ = 0;
    break;
  case 2:
    iVar47 = -(uint)(local_c8._112_4_ == 1);
    local_c8._84_4_ = -(uint)(iStack_54 == 1);
    iVar56 = -(uint)(iStack_54 == 1);
    local_c8._92_4_ = 0xffffffff;
    break;
  case 3:
    bVar41 = local_c8._112_4_ == 1;
    iVar47 = -(uint)(iStack_54 == 1);
    local_c8._84_4_ = -(uint)(iVar56 == 1);
    iVar56 = -(uint)(iVar56 == 1);
    local_c8._92_4_ = 0xffffffff;
    bVar42 = false;
    goto LAB_0034097f;
  case 4:
    bVar41 = local_c8._112_4_ == 1;
    bVar42 = iStack_54 == 1;
    iVar47 = -(uint)(iVar56 == 1);
    local_c8._84_4_ = -(uint)(local_c8._124_4_ == 1);
    iVar56 = -(uint)(local_c8._124_4_ == 1);
    local_c8._92_4_ = 0xffffffff;
    goto LAB_0034097f;
  default:
    iVar47 = 0;
    local_c8._84_4_ = 0;
    iVar56 = 0;
    local_c8._92_4_ = 0;
  }
  bVar42 = false;
  bVar41 = false;
LAB_0034097f:
  local_c8[0x50] = (byte)iVar47;
  local_c8[0x51] = (undefined1)((uint)iVar47 >> 8);
  local_c8[0x52] = (undefined1)((uint)iVar47 >> 0x10);
  local_c8[0x53] = (undefined1)((uint)iVar47 >> 0x18);
  local_c8[0x58] = (byte)iVar56;
  local_c8[0x59] = (undefined1)((uint)iVar56 >> 8);
  local_c8._90_2_ = (undefined2)((uint)iVar56 >> 0x10);
  local_38 = (pointer)(ulong)(uint)this->operation;
  uVar15 = this->operation - 1;
  if (uVar15 < 10) {
    uVar40 = (ulong)uVar15;
    local_1a4 = *(float *)(&DAT_005f8d84 + uVar40 * 4);
    iVar47 = *(int *)(&DAT_005f8dac + uVar40 * 4);
    local_194 = *(int *)(&DAT_005f8dd4 + uVar40 * 4);
  }
  else {
    iVar47 = 0;
    local_1a4 = 0.0;
    local_194 = 0;
  }
  iVar56 = this->keepdims;
  fVar57 = this->coeff;
  sVar2 = bottom_blob->elemsize;
  if (uVar20 == 1) {
    uVar15 = bottom_blob->w;
    Mat::create(top_blob,1,sVar2,opt->blob_allocator);
    this = (Reduction *)bottom_blob->data;
    pRVar30 = (Reduction *)(ulong)uVar15;
    fVar48 = reduction(local_1a4,(float *)this,uVar15,local_194);
    *(float *)top_blob->data = fVar48;
  }
  local_40 = piVar35;
  if (uVar20 == 2) {
    uVar20 = bottom_blob->w;
    unaff_RBP = (Reduction *)(ulong)uVar20;
    uVar15 = bottom_blob->h;
    pRVar21 = (Reduction *)(ulong)uVar15;
    auVar49._8_4_ = 0xffffffff;
    auVar49._0_8_ = 0xffffffffffffffff;
    auVar49._12_4_ = 0xffffffff;
    auVar58[1] = local_c8[0x51];
    auVar58[0] = local_c8[0x50];
    auVar58[2] = local_c8[0x52];
    auVar58[3] = local_c8[0x53];
    auVar58._4_4_ = local_c8._84_4_;
    auVar58[8] = local_c8[0x58];
    auVar58[9] = local_c8[0x59];
    auVar58._10_2_ = local_c8._90_2_;
    auVar58._12_4_ = local_c8._92_4_;
    auVar50._0_8_ = SUB168(auVar49 ^ auVar58,0) << 0x3f;
    auVar50._8_8_ = SUB168(auVar49 ^ auVar58,8) << 0x3f;
    iVar19 = movmskpd(uVar20,auVar50);
    if (iVar19 != 0) {
LAB_00340aac:
      if (((auVar58[0] | (byte)iVar19 >> 1) & 1) == 0) {
        if (iVar56 == 0) {
          pRVar30 = pRVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar15) {
          pRVar25 = (Reduction *)bottom_blob->data;
          iVar34 = bottom_blob->w;
          sVar33 = bottom_blob->elemsize;
          pvVar28 = top_blob->data;
          pRVar17 = (Reduction *)0x0;
          do {
            pRVar30 = unaff_RBP;
            this = pRVar25;
            fVar48 = reduction(local_1a4,(float *)pRVar25,uVar20,local_194);
            *(float *)((long)pvVar28 + (long)pRVar17 * 4) = fVar48;
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pRVar25 = (Reduction *)
                      ((long)&(pRVar25->super_Layer)._vptr_Layer + (long)iVar34 * sVar33);
          } while (pRVar21 != pRVar17);
        }
      }
      if (((local_c8[0x58] | (byte)iVar19) & 1) == 0) {
        if (iVar56 == 0) {
          pRVar30 = unaff_RBP;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = unaff_RBP;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar20) {
          pvVar28 = bottom_blob->data;
          iVar19 = bottom_blob->w;
          pvVar37 = top_blob->data;
          pRVar25 = (Reduction *)((long)unaff_RBP << 2);
          unaff_RBP = (Reduction *)0x0;
          do {
            this = (Reduction *)((long)&(unaff_RBP->super_Layer)._vptr_Layer + (long)pvVar28);
            pRVar30 = pRVar21;
            fVar48 = reduction(local_1a4,(float *)this,uVar15,iVar19,local_194);
            *(float *)((long)&(unaff_RBP->super_Layer)._vptr_Layer + (long)pvVar37) = fVar48;
            unaff_RBP = (Reduction *)((long)&(unaff_RBP->super_Layer)._vptr_Layer + 4);
          } while (pRVar25 != unaff_RBP);
        }
      }
      goto LAB_00340df4;
    }
    if (iVar56 == 0) {
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
    }
    else {
      Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
    }
    local_c8._64_8_ = 0;
    local_c8._0_8_ = (Reduction *)0x0;
    local_c8[8] = false;
    local_c8[9] = false;
    local_c8[10] = false;
    local_c8[0xb] = false;
    local_c8[0xc] = false;
    local_c8[0xd] = false;
    local_c8[0xe] = false;
    local_c8[0xf] = false;
    local_c8[0x10] = false;
    local_c8[0x11] = false;
    local_c8[0x12] = false;
    local_c8[0x13] = false;
    local_c8[0x14] = false;
    local_c8[0x15] = false;
    local_c8[0x16] = false;
    local_c8[0x17] = false;
    local_c8._24_4_ = 0;
    local_c8._32_8_ = (Reduction *)0x0;
    local_c8._40_4_ = 0;
    local_c8._44_4_ = 0;
    local_c8._48_4_ = 0;
    local_c8._52_4_ = 0;
    local_c8._56_4_ = 0;
    Mat::create((Mat *)local_c8,uVar15,sVar2,opt->workspace_allocator);
    this = (Reduction *)local_c8._0_8_;
    bVar43 = (Reduction *)local_c8._0_8_ == (Reduction *)0x0;
    bVar44 = (long)(int)local_c8._56_4_ * local_c8._64_8_ == 0;
    if (!bVar43 && !bVar44) {
      if (0 < (int)uVar15) {
        pfVar36 = (float *)bottom_blob->data;
        iVar34 = bottom_blob->w;
        sVar33 = bottom_blob->elemsize;
        pRVar30 = (Reduction *)0x0;
        do {
          fVar48 = reduction(local_1a4,pfVar36,uVar20,local_194);
          *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar30 * 4) = fVar48;
          pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
          pfVar36 = (float *)((long)pfVar36 + (long)iVar34 * sVar33);
        } while (pRVar21 != pRVar30);
      }
      pRVar30 = (Reduction *)(ulong)uVar15;
      fVar48 = reduction(local_1a4,(float *)this,uVar15,iVar47);
      *(float *)top_blob->data = fVar48;
      piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
      auVar58[1] = local_c8[0x51];
      auVar58[0] = local_c8[0x50];
      auVar58[2] = local_c8[0x52];
      auVar58[3] = local_c8[0x53];
      auVar58._4_4_ = local_c8._84_4_;
      auVar58[8] = local_c8[0x58];
      auVar58[9] = local_c8[0x59];
      auVar58._10_2_ = local_c8._90_2_;
      auVar58._12_4_ = local_c8._92_4_;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          this = (Reduction *)local_c8._32_8_;
          if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) {
            pRVar30 = (Reduction *)local_c8._0_8_;
            if ((Reduction *)local_c8._0_8_ != (Reduction *)0x0) {
              this = (Reduction *)local_c8._0_8_;
              free((void *)local_c8._0_8_);
              auVar58[1] = local_c8[0x51];
              auVar58[0] = local_c8[0x50];
              auVar58[2] = local_c8[0x52];
              auVar58[3] = local_c8[0x53];
              auVar58._4_4_ = local_c8._84_4_;
              auVar58[8] = local_c8[0x58];
              auVar58[9] = local_c8[0x59];
              auVar58._10_2_ = local_c8._90_2_;
              auVar58._12_4_ = local_c8._92_4_;
              pRVar30 = (Reduction *)local_c8._0_8_;
            }
          }
          else {
            (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
            auVar58[1] = local_c8[0x51];
            auVar58[0] = local_c8[0x50];
            auVar58[2] = local_c8[0x52];
            auVar58[3] = local_c8[0x53];
            auVar58._4_4_ = local_c8._84_4_;
            auVar58[8] = local_c8[0x58];
            auVar58[9] = local_c8[0x59];
            auVar58._10_2_ = local_c8._90_2_;
            auVar58._12_4_ = local_c8._92_4_;
            pRVar30 = (Reduction *)local_c8._0_8_;
          }
        }
      }
      local_c8._64_8_ = 0;
      local_c8._0_8_ = (_func_int **)0x0;
      local_c8[8] = false;
      local_c8[9] = false;
      local_c8[10] = false;
      local_c8[0xb] = false;
      local_c8[0xc] = false;
      local_c8[0xd] = false;
      local_c8[0xe] = false;
      local_c8[0xf] = false;
      local_c8[0x10] = false;
      local_c8[0x11] = false;
      local_c8[0x12] = false;
      local_c8[0x13] = false;
      local_c8[0x14] = false;
      local_c8[0x15] = false;
      local_c8[0x16] = false;
      local_c8[0x17] = false;
      local_c8._24_4_ = 0;
      local_c8._40_4_ = 0;
      local_c8._44_4_ = 0;
      local_c8._48_4_ = 0;
      local_c8._52_4_ = 0;
      local_c8._56_4_ = 0;
      if (bVar43 || bVar44) {
        return -100;
      }
      goto LAB_00340aac;
    }
    piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) goto LAB_0034203d;
      if ((Reduction *)local_c8._32_8_ != (Reduction *)0x0) {
        (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
        goto LAB_0034203d;
      }
LAB_00342030:
      if ((Reduction *)local_c8._0_8_ != (Reduction *)0x0) {
        free((void *)local_c8._0_8_);
      }
    }
LAB_0034203d:
    iVar47 = -100;
  }
  else {
LAB_00340df4:
    if ((int)local_40 == 3) {
      uVar20 = bottom_blob->w;
      uVar15 = bottom_blob->h;
      pRVar21 = (Reduction *)(ulong)uVar15;
      uVar1 = bottom_blob->c;
      pRVar25 = (Reduction *)(ulong)uVar1;
      uVar16 = uVar15 * uVar20;
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar6[1] = local_c8[0x51];
      auVar6[0] = local_c8[0x50];
      auVar6[2] = local_c8[0x52];
      auVar6[3] = local_c8[0x53];
      auVar6._4_4_ = local_c8._84_4_;
      auVar6[8] = local_c8[0x58];
      auVar6[9] = local_c8[0x59];
      auVar6._10_2_ = local_c8._90_2_;
      auVar6._12_4_ = local_c8._92_4_;
      auVar52._0_8_ = SUB168(auVar51 ^ auVar6,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar51 ^ auVar6,8) << 0x3f;
      uVar26 = movmskpd((int)unaff_RBP,auVar52);
      uVar40 = (ulong)uVar26;
      bVar43 = (bool)(bVar41 ^ 1);
      if ((uVar26 == 0) && (!bVar43)) {
        if (iVar56 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        }
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (Reduction *)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._32_8_ = (Reduction *)0x0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        Mat::create((Mat *)local_c8,uVar1,sVar2,opt->workspace_allocator);
        this = (Reduction *)local_c8._0_8_;
        bVar44 = (Reduction *)local_c8._0_8_ == (Reduction *)0x0;
        bVar45 = (long)(int)local_c8._56_4_ * local_c8._64_8_ == 0;
        if (bVar44 || bVar45) {
          piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) goto LAB_00342030;
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
            }
          }
          goto LAB_0034203d;
        }
        if (0 < (int)uVar1) {
          pfVar36 = (float *)bottom_blob->data;
          sVar33 = bottom_blob->elemsize;
          sVar32 = bottom_blob->cstep;
          pRVar30 = (Reduction *)0x0;
          do {
            fVar48 = reduction(local_1a4,pfVar36,uVar16,local_194);
            *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar30 * 4) = fVar48;
            pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
            pfVar36 = (float *)((long)pfVar36 + sVar33 * sVar32);
          } while (pRVar25 != pRVar30);
        }
        pRVar30 = (Reduction *)(ulong)uVar1;
        fVar48 = reduction(local_1a4,(float *)this,uVar1,iVar47);
        *(float *)top_blob->data = fVar48;
        piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        uVar40 = 0;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            this = (Reduction *)local_c8._32_8_;
            if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) {
              pRVar30 = (Reduction *)local_c8._0_8_;
              if ((Reduction *)local_c8._0_8_ != (Reduction *)0x0) {
                this = (Reduction *)local_c8._0_8_;
                free((void *)local_c8._0_8_);
                pRVar30 = (Reduction *)local_c8._0_8_;
              }
            }
            else {
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
              pRVar30 = (Reduction *)local_c8._0_8_;
            }
          }
        }
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (_func_int **)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        if (bVar44 || bVar45) {
          return -100;
        }
      }
      pRVar17 = (Reduction *)(ulong)uVar20;
      local_148._0_1_ = (byte)(uVar40 >> 1) & 0x7f;
      if (uVar26 == 0 && !bVar41) {
        if (iVar56 == 0) {
          pRVar30 = pRVar25;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,uVar1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          pRVar31 = (Reduction *)bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          sVar32 = bottom_blob->elemsize;
          pfVar36 = (float *)top_blob->data;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          pRVar18 = pRVar25;
          pfVar39 = pfVar36;
          do {
            pfVar38 = pfVar39;
            if (iVar56 == 0) {
              pfVar38 = pfVar36;
            }
            pRVar30 = (Reduction *)(ulong)uVar16;
            this = pRVar31;
            fVar48 = reduction(local_1a4,(float *)pRVar31,uVar16,local_194);
            *pfVar38 = fVar48;
            pfVar39 = (float *)((long)pfVar39 + sVar3 * sVar4);
            pRVar31 = (Reduction *)((long)&(pRVar31->super_Layer)._vptr_Layer + sVar33 * sVar32);
            pfVar36 = pfVar36 + 1;
            pRVar18 = (Reduction *)&pRVar18[-1].field_0x12f;
          } while (pRVar18 != (Reduction *)0x0);
        }
      }
      bVar13 = local_c8[0x50];
      local_148._0_1_ = (byte)local_148 | local_c8[0x50];
      if (((byte)local_148 & 1) == 0 && !bVar43) {
        if (iVar56 == 0) {
          pRVar30 = pRVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar15) {
          iVar19 = bottom_blob->w;
          sVar33 = bottom_blob->elemsize;
          pRVar31 = (Reduction *)bottom_blob->data;
          sVar32 = bottom_blob->cstep;
          pvVar28 = top_blob->data;
          pRVar18 = (Reduction *)0x0;
          do {
            pRVar30 = pRVar17;
            this = pRVar31;
            fVar48 = reduction(local_1a4,(float *)pRVar31,uVar20,uVar1,(int)sVar32,local_194);
            *(float *)((long)pvVar28 + (long)pRVar18 * 4) = fVar48;
            pRVar18 = (Reduction *)((long)&(pRVar18->super_Layer)._vptr_Layer + 1);
            pRVar31 = (Reduction *)
                      ((long)&(pRVar31->super_Layer)._vptr_Layer + (long)iVar19 * sVar33);
          } while (pRVar21 != pRVar18);
        }
      }
      bVar22 = local_c8[0x58];
      bVar12 = (byte)uVar40 | local_c8[0x58];
      if ((bVar12 & 1) == 0 && !bVar43) {
        if (iVar56 == 0) {
          pRVar30 = (Reduction *)(ulong)uVar20;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = pRVar17;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar20) {
          pvVar28 = bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          pvVar37 = top_blob->data;
          lVar27 = 0;
          do {
            this = (Reduction *)((long)pvVar28 + lVar27);
            pRVar30 = pRVar21;
            fVar48 = reduction(local_1a4,(float *)this,uVar15,uVar20,uVar1,(int)sVar33,local_194);
            *(float *)((long)pvVar37 + lVar27) = fVar48;
            lVar27 = lVar27 + 4;
          } while ((long)pRVar17 * 4 - lVar27 != 0);
        }
      }
      if (((byte)local_148 & 1) == 0 && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,uVar1,sVar2,opt->blob_allocator);
        }
        pRVar30 = pRVar21;
        if (0 < (int)uVar1) {
          sVar33 = bottom_blob->cstep;
          if (iVar56 == 0) {
            sVar32 = (size_t)top_blob->w;
          }
          else {
            sVar32 = top_blob->cstep;
          }
          local_170 = (float *)bottom_blob->data;
          pvVar28 = top_blob->data;
          this = (Reduction *)(sVar32 * top_blob->elemsize);
          sVar32 = bottom_blob->elemsize;
          pRVar31 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar15) {
              pRVar30 = (Reduction *)0x0;
              pfVar36 = local_170;
              do {
                fVar48 = reduction(local_1a4,pfVar36,uVar20,local_194);
                *(float *)((long)pvVar28 + (long)pRVar30 * 4) = fVar48;
                pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
                pfVar36 = pfVar36 + (int)uVar20;
              } while (pRVar21 != pRVar30);
            }
            pRVar31 = (Reduction *)((long)&(pRVar31->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar28);
            local_170 = (float *)((long)local_170 + sVar33 * sVar32);
            pRVar30 = pRVar21;
          } while (pRVar31 != pRVar25);
        }
      }
      if (((bVar13 | bVar22) & 1) == 0 && !bVar43) {
        if (iVar56 == 0) {
          pRVar30 = pRVar17;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = pRVar17;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          pvVar28 = bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          pvVar37 = top_blob->data;
          lVar27 = 0;
          do {
            this = (Reduction *)((long)pvVar28 + lVar27);
            pRVar30 = pRVar25;
            fVar48 = reduction(local_1a4,(float *)this,uVar1,(int)sVar33,local_194);
            *(float *)((long)pvVar37 + lVar27) = fVar48;
            lVar27 = lVar27 + 4;
          } while ((ulong)uVar16 << 2 != lVar27);
        }
      }
      if ((bVar12 & 1) == 0 && !bVar41) {
        if (iVar56 == 0) {
          pRVar30 = pRVar17;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          pRVar30 = pRVar17;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,uVar1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          sVar33 = bottom_blob->cstep;
          if (iVar56 == 0) {
            sVar32 = (size_t)top_blob->w;
          }
          else {
            sVar32 = top_blob->cstep;
          }
          pvVar28 = bottom_blob->data;
          pvVar37 = top_blob->data;
          sVar3 = top_blob->elemsize;
          sVar4 = bottom_blob->elemsize;
          pRVar31 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar20) {
              lVar27 = 0;
              do {
                this = (Reduction *)(lVar27 + (long)pvVar28);
                pRVar30 = pRVar21;
                fVar48 = reduction(local_1a4,(float *)this,uVar15,uVar20,local_194);
                *(float *)((long)pvVar37 + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((long)pRVar17 * 4 != lVar27);
            }
            pRVar31 = (Reduction *)((long)&(pRVar31->super_Layer)._vptr_Layer + 1);
            pvVar37 = (void *)((long)pvVar37 + sVar32 * sVar3);
            pvVar28 = (void *)((long)pvVar28 + sVar33 * sVar4);
          } while (pRVar31 != pRVar25);
        }
      }
    }
    if ((int)local_40 == 4) {
      uVar20 = bottom_blob->w;
      uVar15 = bottom_blob->h;
      uVar40 = (ulong)uVar15;
      uVar1 = bottom_blob->d;
      pRVar21 = (Reduction *)(ulong)uVar1;
      uVar16 = bottom_blob->c;
      pRVar25 = (Reduction *)(ulong)uVar16;
      uVar26 = uVar15 * uVar20;
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar7[1] = local_c8[0x51];
      auVar7[0] = local_c8[0x50];
      auVar7[2] = local_c8[0x52];
      auVar7[3] = local_c8[0x53];
      auVar7._4_4_ = local_c8._84_4_;
      auVar7[8] = local_c8[0x58];
      auVar7[9] = local_c8[0x59];
      auVar7._10_2_ = local_c8._90_2_;
      auVar7._12_4_ = local_c8._92_4_;
      auVar54._0_8_ = SUB168(auVar53 ^ auVar7,0) << 0x3f;
      auVar54._8_8_ = SUB168(auVar53 ^ auVar7,8) << 0x3f;
      iVar19 = movmskpd(uVar26,auVar54);
      bVar44 = iVar19 == 0;
      bVar13 = bVar42 ^ 1;
      bVar43 = (bool)(bVar41 ^ 1);
      if ((bVar44 && bVar13 == 0) && (!bVar43)) {
        if (iVar56 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar2,opt->blob_allocator);
        }
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (Reduction *)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._32_8_ = (Reduction *)0x0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        Mat::create((Mat *)local_c8,uVar16,sVar2,opt->workspace_allocator);
        this = (Reduction *)local_c8._0_8_;
        bVar45 = (Reduction *)local_c8._0_8_ == (Reduction *)0x0;
        bVar46 = (long)(int)local_c8._56_4_ * local_c8._64_8_ == 0;
        if (bVar45 || bVar46) {
          piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) goto LAB_00342030;
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
            }
          }
          goto LAB_0034203d;
        }
        if (0 < (int)uVar16) {
          pfVar36 = (float *)bottom_blob->data;
          sVar33 = bottom_blob->elemsize;
          sVar32 = bottom_blob->cstep;
          pRVar30 = (Reduction *)0x0;
          do {
            fVar48 = reduction(local_1a4,pfVar36,uVar26 * uVar1,local_194);
            *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar30 * 4) = fVar48;
            pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
            pfVar36 = (float *)((long)pfVar36 + sVar33 * sVar32);
          } while (pRVar25 != pRVar30);
        }
        fVar48 = reduction(local_1a4,(float *)this,uVar16,iVar47);
        *(float *)top_blob->data = fVar48;
        piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            this = (Reduction *)local_c8._32_8_;
            if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) {
              if ((Reduction *)local_c8._0_8_ != (Reduction *)0x0) {
                free((void *)local_c8._0_8_);
                this = (Reduction *)local_c8._0_8_;
              }
            }
            else {
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
            }
          }
        }
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (_func_int **)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        if (bVar45 || bVar46) {
          return -100;
        }
      }
      if ((bVar44 && bVar13 == 0) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          pRVar30 = (Reduction *)bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          sVar32 = bottom_blob->elemsize;
          pfVar36 = (float *)top_blob->data;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          pRVar17 = pRVar25;
          pfVar39 = pfVar36;
          do {
            pfVar38 = pfVar39;
            if (iVar56 == 0) {
              pfVar38 = pfVar36;
            }
            this = pRVar30;
            fVar48 = reduction(local_1a4,(float *)pRVar30,uVar26 * uVar1,local_194);
            *pfVar38 = fVar48;
            pfVar39 = (float *)((long)pfVar39 + sVar3 * sVar4);
            pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + sVar33 * sVar32);
            pfVar36 = pfVar36 + 1;
            pRVar17 = (Reduction *)&pRVar17[-1].field_0x12f;
          } while (pRVar17 != (Reduction *)0x0);
        }
      }
      if ((bVar44 && bVar42 == false) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,uVar1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          iVar34 = bottom_blob->w;
          iVar23 = bottom_blob->h;
          pRVar30 = (Reduction *)bottom_blob->data;
          sVar32 = bottom_blob->cstep;
          pvVar28 = top_blob->data;
          sVar33 = bottom_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          do {
            this = pRVar30;
            fVar48 = reduction(local_1a4,(float *)pRVar30,uVar26,uVar16,(int)sVar32,local_194);
            *(float *)((long)pvVar28 + (long)pRVar17 * 4) = fVar48;
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pRVar30 = (Reduction *)
                      ((long)&(pRVar30->super_Layer)._vptr_Layer +
                      (long)iVar34 * sVar33 * (long)iVar23);
          } while (pRVar21 != pRVar17);
        }
      }
      bVar22 = local_c8[0x50];
      auVar59[4] = local_c8[0x58];
      auVar59._0_4_ = local_c8._84_4_;
      auVar59[5] = local_c8[0x59];
      auVar59._6_2_ = local_c8._90_2_;
      auVar59._8_4_ = local_c8._92_4_;
      auVar59._12_4_ = 0;
      auVar59 = auVar59 << 0x20;
      bVar12 = (byte)iVar19 >> 1 | local_c8[0x50];
      if (((bVar12 & 1) == 0 && bVar13 == 0) && !bVar43) {
        if (iVar56 == 0) {
          Mat::create(top_blob,uVar15,sVar2,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar15,1,1,sVar2,opt->blob_allocator);
        }
        this = (Reduction *)local_c8;
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (Reduction *)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._32_8_ = (Reduction *)0x0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        Mat::create((Mat *)this,uVar15,1,uVar16,sVar2,opt->workspace_allocator);
        bVar45 = (Reduction *)local_c8._0_8_ == (Reduction *)0x0;
        bVar46 = (long)(int)local_c8._56_4_ * local_c8._64_8_ == 0;
        if (bVar45 || bVar46) {
          piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) goto LAB_00342030;
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
            }
          }
          goto LAB_0034203d;
        }
        local_c8._104_8_ = local_c8._0_8_;
        if (0 < (int)uVar16) {
          sVar33 = bottom_blob->elemsize;
          lVar27 = CONCAT44(local_c8._20_4_,local_c8._16_4_) * local_c8._64_8_;
          sVar32 = bottom_blob->cstep;
          local_158 = (float *)bottom_blob->data;
          pRVar30 = (Reduction *)0x0;
          this = (Reduction *)local_c8._0_8_;
          do {
            if (0 < (int)uVar15) {
              uVar29 = 0;
              pfVar36 = local_158;
              do {
                fVar48 = reduction(local_1a4,pfVar36,uVar20,uVar1,uVar26,local_194);
                *(float *)((long)&(this->super_Layer)._vptr_Layer + uVar29 * 4) = fVar48;
                uVar29 = uVar29 + 1;
                pfVar36 = pfVar36 + (int)uVar20;
              } while (uVar40 != uVar29);
            }
            pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
            this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + lVar27);
            local_158 = (float *)((long)local_158 + sVar33 * sVar32);
          } while (pRVar30 != pRVar25);
        }
        uVar11 = local_c8._104_8_;
        if (0 < (int)uVar15) {
          stride = local_c8._64_4_;
          pvVar28 = top_blob->data;
          lVar27 = 0;
          do {
            this = (Reduction *)(uVar11 + lVar27);
            fVar48 = reduction(local_1a4,(float *)this,uVar16,stride,iVar47);
            *(float *)((long)pvVar28 + lVar27) = fVar48;
            lVar27 = lVar27 + 4;
          } while (uVar40 * 4 - lVar27 != 0);
        }
        piVar5 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        auVar8[4] = local_c8[0x58];
        auVar8._0_4_ = local_c8._84_4_;
        auVar8[5] = local_c8[0x59];
        auVar8._6_2_ = local_c8._90_2_;
        auVar8._8_4_ = local_c8._92_4_;
        auVar8._12_4_ = 0;
        auVar59 = auVar8 << 0x20;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            this = (Reduction *)local_c8._32_8_;
            if ((Reduction *)local_c8._32_8_ == (Reduction *)0x0) {
              if ((Reduction *)local_c8._0_8_ != (Reduction *)0x0) {
                free((void *)local_c8._0_8_);
                auVar10[4] = local_c8[0x58];
                auVar10._0_4_ = local_c8._84_4_;
                auVar10[5] = local_c8[0x59];
                auVar10._6_2_ = local_c8._90_2_;
                auVar10._8_4_ = local_c8._92_4_;
                auVar10._12_4_ = 0;
                auVar59 = auVar10 << 0x20;
                this = (Reduction *)local_c8._0_8_;
              }
            }
            else {
              (*((Layer *)local_c8._32_8_)->_vptr_Layer[3])();
              auVar9[4] = local_c8[0x58];
              auVar9._0_4_ = local_c8._84_4_;
              auVar9[5] = local_c8[0x59];
              auVar9._6_2_ = local_c8._90_2_;
              auVar9._8_4_ = local_c8._92_4_;
              auVar9._12_4_ = 0;
              auVar59 = auVar9 << 0x20;
            }
          }
        }
        local_c8._64_8_ = 0;
        local_c8._0_8_ = (_func_int **)0x0;
        local_c8[8] = false;
        local_c8[9] = false;
        local_c8[10] = false;
        local_c8[0xb] = false;
        local_c8[0xc] = false;
        local_c8[0xd] = false;
        local_c8[0xe] = false;
        local_c8[0xf] = false;
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        local_c8[0x12] = false;
        local_c8[0x13] = false;
        local_c8[0x14] = false;
        local_c8[0x15] = false;
        local_c8[0x16] = false;
        local_c8[0x17] = false;
        local_c8._24_4_ = 0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_4_ = 0;
        local_c8._52_4_ = 0;
        local_c8._56_4_ = 0;
        if (bVar45 || bVar46) {
          return -100;
        }
      }
      pRVar30 = (Reduction *)(ulong)uVar20;
      bVar14 = (byte)iVar19 | auVar59[8];
      local_c8[0x68] = bVar14 | bVar13;
      if (((bVar14 & 1) == 0 && bVar13 == 0) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar20) {
          pvVar28 = bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          pvVar37 = top_blob->data;
          lVar27 = 0;
          do {
            this = (Reduction *)((long)pvVar28 + lVar27);
            fVar48 = reduction(local_1a4,(float *)this,uVar15 * uVar1,uVar20,uVar16,(int)sVar33,
                               local_194);
            *(float *)((long)pvVar37 + lVar27) = fVar48;
            lVar27 = lVar27 + 4;
          } while ((long)pRVar30 * 4 - lVar27 != 0);
        }
      }
      if ((bVar44 && bVar42 == false) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          sVar33 = bottom_blob->cstep;
          if (iVar56 == 0) {
            sVar32 = (size_t)top_blob->w;
          }
          else {
            sVar32 = top_blob->cstep;
          }
          local_188 = (Reduction *)bottom_blob->data;
          pvVar28 = top_blob->data;
          sVar3 = top_blob->elemsize;
          sVar4 = bottom_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar1) {
              pRVar18 = (Reduction *)0x0;
              pRVar31 = local_188;
              do {
                this = pRVar31;
                fVar48 = reduction(local_1a4,(float *)pRVar31,uVar26,local_194);
                *(float *)((long)pvVar28 + (long)pRVar18 * 4) = fVar48;
                pRVar18 = (Reduction *)((long)&(pRVar18->super_Layer)._vptr_Layer + 1);
                pRVar31 = (Reduction *)
                          ((long)&(pRVar31->super_Layer)._vptr_Layer + (long)(int)uVar26 * 4);
              } while (pRVar21 != pRVar18);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)pvVar28 + sVar32 * sVar3);
            local_188 = (Reduction *)((long)&(local_188->super_Layer)._vptr_Layer + sVar33 * sVar4);
          } while (pRVar17 != pRVar25);
        }
      }
      if (((bVar12 & 1) == 0 && bVar42 == false) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,uVar1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          this = (Reduction *)((long)bottom_blob->w * bottom_blob->elemsize);
          pvVar28 = top_blob->data;
          iVar47 = bottom_blob->h;
          local_148 = (float *)bottom_blob->data;
          sVar33 = bottom_blob->cstep;
          lVar27 = (long)top_blob->h * (long)top_blob->w;
          if (iVar56 == 0) {
            lVar27 = (long)top_blob->w;
          }
          sVar32 = top_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar15) {
              uVar29 = 0;
              pfVar36 = local_148;
              do {
                fVar48 = reduction(local_1a4,pfVar36,uVar20,uVar16,(int)sVar33,local_194);
                *(float *)((long)pvVar28 + uVar29 * 4) = fVar48;
                uVar29 = uVar29 + 1;
                pfVar36 = (float *)((long)pfVar36 + (long)this);
              } while (uVar40 != uVar29);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)pvVar28 + lVar27 * sVar32);
            local_148 = (float *)((long)local_148 + (long)iVar47 * (long)this);
          } while (pRVar17 != pRVar21);
        }
      }
      bVar22 = bVar22 | auVar59[8];
      if ((bVar13 == 0 && (bVar22 & 1) == 0) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar15) {
          this = (Reduction *)top_blob->data;
          iVar47 = top_blob->w;
          pvVar28 = bottom_blob->data;
          iVar19 = bottom_blob->w;
          sVar3 = bottom_blob->cstep;
          sVar33 = top_blob->elemsize;
          sVar32 = bottom_blob->elemsize;
          uVar29 = 0;
          do {
            if (0 < (int)uVar20) {
              lVar27 = 0;
              do {
                fVar48 = reduction(local_1a4,(float *)((long)pvVar28 + lVar27),uVar1,uVar26,uVar16,
                                   (int)sVar3,local_194);
                *(float *)((long)&(this->super_Layer)._vptr_Layer + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((long)pRVar30 * 4 != lVar27);
            }
            uVar29 = uVar29 + 1;
            this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + (long)iVar47 * sVar33);
            pvVar28 = (void *)((long)pvVar28 + (long)iVar19 * sVar32);
          } while (uVar29 != uVar40);
        }
      }
      if (((bVar12 & 1) == 0 && bVar13 == 0) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          sVar33 = bottom_blob->cstep;
          if (iVar56 == 0) {
            sVar32 = (size_t)top_blob->w;
          }
          else {
            sVar32 = top_blob->cstep;
          }
          local_148 = (float *)bottom_blob->data;
          pvVar28 = top_blob->data;
          sVar3 = top_blob->elemsize;
          sVar4 = bottom_blob->elemsize;
          this = (Reduction *)0x0;
          do {
            if (0 < (int)uVar15) {
              uVar29 = 0;
              pfVar36 = local_148;
              do {
                fVar48 = reduction(local_1a4,pfVar36,uVar20,uVar1,uVar26,local_194);
                *(float *)((long)pvVar28 + uVar29 * 4) = fVar48;
                uVar29 = uVar29 + 1;
                pfVar36 = pfVar36 + (int)uVar20;
              } while (uVar40 != uVar29);
            }
            this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)pvVar28 + sVar32 * sVar3);
            local_148 = (float *)((long)local_148 + sVar33 * sVar4);
          } while (this != pRVar25);
        }
      }
      if (((bVar14 & 1) == 0 && bVar42 == false) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,uVar1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          pvVar28 = top_blob->data;
          iVar47 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          pvVar37 = bottom_blob->data;
          sVar32 = bottom_blob->cstep;
          pRVar31 = (Reduction *)((long)top_blob->w * top_blob->elemsize);
          sVar33 = bottom_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          this = pRVar31;
          do {
            if (0 < (int)uVar20) {
              lVar27 = 0;
              do {
                this = (Reduction *)(lVar27 + (long)pvVar37);
                fVar48 = reduction(local_1a4,(float *)this,uVar15,uVar20,uVar16,(int)sVar32,
                                   local_194);
                *(float *)((long)pvVar28 + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((long)pRVar30 * 4 != lVar27);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)&(pRVar31->super_Layer)._vptr_Layer + (long)pvVar28);
            pvVar37 = (void *)((long)pvVar37 + (long)iVar19 * sVar33 * (long)iVar47);
          } while (pRVar17 != pRVar21);
        }
      }
      if ((local_c8._104_8_ & 1) == 0 && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          sVar33 = bottom_blob->cstep;
          if (iVar56 == 0) {
            sVar32 = (size_t)top_blob->w;
          }
          else {
            sVar32 = top_blob->cstep;
          }
          pvVar28 = bottom_blob->data;
          pvVar37 = top_blob->data;
          this = (Reduction *)(sVar32 * top_blob->elemsize);
          sVar32 = bottom_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar20) {
              lVar27 = 0;
              do {
                fVar48 = reduction(local_1a4,(float *)((long)pvVar28 + lVar27),uVar1 * uVar15,uVar20
                                   ,local_194);
                *(float *)((long)pvVar37 + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((long)pRVar30 * 4 != lVar27);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar37 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar37);
            pvVar28 = (void *)((long)pvVar28 + sVar33 * sVar32);
          } while (pRVar17 != pRVar25);
        }
      }
      if (((bVar12 & 1) == 0 && bVar42 == false) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar15,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar15,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          local_148 = (float *)bottom_blob->data;
          sVar33 = bottom_blob->elemsize;
          pvVar28 = top_blob->data;
          sVar32 = top_blob->elemsize;
          sVar3 = top_blob->cstep;
          sVar4 = bottom_blob->cstep;
          this = (Reduction *)0x0;
          do {
            if (0 < (int)(uVar15 * uVar1)) {
              uVar40 = 0;
              pfVar36 = local_148;
              do {
                fVar48 = reduction(local_1a4,pfVar36,uVar20,local_194);
                *(float *)((long)pvVar28 + uVar40 * 4) = fVar48;
                uVar40 = uVar40 + 1;
                pfVar36 = pfVar36 + (int)uVar20;
              } while (uVar15 * uVar1 != uVar40);
            }
            this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)pvVar28 + sVar32 * sVar3);
            local_148 = (float *)((long)local_148 + sVar33 * sVar4);
          } while (this != pRVar25);
        }
      }
      if (((bVar22 & 1) == 0 && bVar42 == false) && !bVar43) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,uVar1,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,uVar1,1,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          iVar47 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          if (iVar56 == 0) {
            sVar33 = top_blob->cstep;
          }
          else {
            sVar33 = (long)top_blob->h * (long)top_blob->w;
          }
          pvVar28 = top_blob->data;
          pvVar37 = bottom_blob->data;
          sVar32 = bottom_blob->cstep;
          this = (Reduction *)(sVar33 * top_blob->elemsize);
          sVar33 = bottom_blob->elemsize;
          pRVar17 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar26) {
              lVar27 = 0;
              do {
                fVar48 = reduction(local_1a4,(float *)((long)pvVar37 + lVar27),uVar16,(int)sVar32,
                                   local_194);
                *(float *)((long)pvVar28 + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((ulong)uVar26 << 2 != lVar27);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar28 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar28);
            pvVar37 = (void *)((long)pvVar37 + (long)iVar19 * sVar33 * (long)iVar47);
          } while (pRVar17 != pRVar21);
        }
      }
      if (((bVar14 & 1) == 0 && bVar42 == false) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,1,uVar1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          iVar47 = top_blob->w;
          local_110 = top_blob->data;
          sVar33 = top_blob->elemsize;
          iVar19 = bottom_blob->w;
          iVar34 = bottom_blob->h;
          local_f0 = bottom_blob->data;
          sVar32 = bottom_blob->elemsize;
          sVar3 = top_blob->cstep;
          sVar4 = bottom_blob->cstep;
          pRVar17 = (Reduction *)0x0;
          this = (Reduction *)bottom_blob;
          do {
            if (0 < (int)uVar1) {
              this = (Reduction *)0x0;
              pvVar28 = local_110;
              pvVar37 = local_f0;
              do {
                if (0 < (int)uVar20) {
                  lVar27 = 0;
                  do {
                    fVar48 = reduction(local_1a4,(float *)((long)pvVar37 + lVar27),uVar15,uVar20,
                                       local_194);
                    *(float *)((long)pvVar28 + lVar27) = fVar48;
                    lVar27 = lVar27 + 4;
                  } while ((long)pRVar30 * 4 - lVar27 != 0);
                }
                this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + 1);
                pvVar28 = (void *)((long)pvVar28 + (long)iVar47 * sVar33);
                pvVar37 = (void *)((long)pvVar37 + (long)iVar34 * sVar32 * (long)iVar19);
              } while (this != pRVar21);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            local_110 = (void *)((long)local_110 + sVar3 * sVar33);
            local_f0 = (void *)((long)local_f0 + sVar4 * sVar32);
          } while (pRVar17 != pRVar25);
        }
      }
      if ((bVar13 == 0 && (bVar22 & 1) == 0) && !bVar41) {
        if (iVar56 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,uVar16,sVar2,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar20,uVar15,1,uVar16,sVar2,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          pvVar28 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar37 = top_blob->data;
          sVar33 = top_blob->elemsize;
          sVar32 = top_blob->cstep;
          sVar3 = bottom_blob->cstep;
          pRVar17 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar26) {
              lVar27 = 0;
              do {
                this = (Reduction *)((long)pvVar28 + lVar27);
                fVar48 = reduction(local_1a4,(float *)this,uVar1,uVar26,local_194);
                *(float *)((long)pvVar37 + lVar27) = fVar48;
                lVar27 = lVar27 + 4;
              } while ((ulong)uVar26 << 2 != lVar27);
            }
            pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1);
            pvVar37 = (void *)((long)pvVar37 + sVar33 * sVar32);
            pvVar28 = (void *)((long)pvVar28 + sVar2 * sVar3);
            pRVar30 = pRVar21;
          } while (pRVar17 != pRVar25);
        }
      }
    }
    uVar20 = (uint)pRVar30;
    iVar56 = (int)this;
    iVar47 = (int)local_38;
    if ((iVar47 - 9U < 2) && (uVar15 = top_blob->c * (int)top_blob->cstep, 0 < (int)uVar15)) {
      pvVar28 = top_blob->data;
      uVar40 = 0;
      do {
        fVar48 = logf(*(float *)((long)pvVar28 + uVar40 * 4));
        uVar20 = (uint)pRVar30;
        iVar56 = (int)this;
        *(float *)((long)pvVar28 + uVar40 * 4) = fVar48;
        uVar40 = uVar40 + 1;
      } while (uVar15 != uVar40);
    }
    if (iVar47 == 3) {
      iVar34 = (int)local_40;
      iVar47 = bottom_blob->w;
      iVar19 = 1;
      if (iVar34 == 1) {
        iVar19 = iVar47;
      }
      auVar55._0_8_ = (ulong)local_c8[0x50] << 0x3f;
      auVar55._8_8_ = (ulong)local_c8[0x58] << 0x3f;
      if (iVar34 == 2) {
        uVar20 = movmskpd(uVar20,auVar55);
        iVar23 = 1;
        if ((uVar20 & 2) != 0) {
          iVar23 = iVar47;
        }
        iVar19 = iVar19 * iVar23;
        if ((uVar20 & 1) != 0) {
          iVar19 = iVar19 * bottom_blob->h;
        }
      }
      if (iVar34 == 3) {
        uVar20 = movmskpd(uVar20,auVar55);
        iVar23 = 1;
        iVar56 = 1;
        if ((uVar20 & 2) != 0) {
          iVar56 = iVar47;
        }
        if ((uVar20 & 1) != 0) {
          iVar23 = bottom_blob->h;
        }
        iVar19 = iVar19 * iVar56 * iVar23;
        if (bVar41) {
          iVar19 = iVar19 * bottom_blob->c;
        }
      }
      if (iVar34 == 4) {
        uVar20 = movmskpd(iVar56,auVar55);
        iVar56 = 1;
        if ((uVar20 & 2) == 0) {
          iVar47 = 1;
        }
        iVar34 = 1;
        if ((uVar20 & 1) != 0) {
          iVar34 = bottom_blob->h;
        }
        if (bVar42 != false) {
          iVar56 = bottom_blob->d;
        }
        iVar19 = iVar19 * iVar47 * iVar56 * iVar34;
        if (bVar41) {
          iVar19 = iVar19 * bottom_blob->c;
        }
      }
      fVar57 = fVar57 / (float)iVar19;
    }
    else if ((iVar47 == 8) && (uVar20 = top_blob->c * (int)top_blob->cstep, 0 < (int)uVar20)) {
      pvVar28 = top_blob->data;
      uVar40 = 0;
      do {
        fVar48 = *(float *)((long)pvVar28 + uVar40 * 4);
        *(float *)((long)pvVar28 + uVar40 * 4) =
             SQRT((float)(~-(uint)(fVar48 < 1.1754944e-38) & (uint)fVar48));
        uVar40 = uVar40 + 1;
      } while (uVar20 != uVar40);
    }
    iVar47 = 0;
    if ((fVar57 != 1.0) &&
       (uVar20 = top_blob->c * (int)top_blob->cstep, iVar47 = 0, 0 < (int)uVar20)) {
      pvVar28 = top_blob->data;
      iVar47 = 0;
      uVar40 = 0;
      do {
        *(float *)((long)pvVar28 + uVar40 * 4) = *(float *)((long)pvVar28 + uVar40 * 4) * fVar57;
        uVar40 = uVar40 + 1;
      } while (uVar20 != uVar40);
    }
  }
  return iVar47;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    return reduction_op(bottom_blob, top_blob, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, operation, coeff, opt);
}